

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O2

vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> * __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::getSampleArgs
          (vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           *__return_storage_ptr__,Generator *this)

{
  undefined8 uVar1;
  Texture2DGradientTestCase *pTVar2;
  int iVar3;
  deInt32 j;
  int iVar4;
  long lVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar6 [16];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar9 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [52];
  float fStack_e4;
  float local_e0;
  float local_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 local_cc;
  float local_c8 [4];
  undefined1 *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  SampleArguments local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
    )._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
    )._M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  pTVar2 = this->m_testCase;
  if (pTVar2->m_useDerivatives == false) {
    uVar7 = 0;
    for (iVar3 = 0; iVar3 <= (pTVar2->m_dimensions).m_data[0] * 2; iVar3 = iVar3 + 1) {
      uVar8 = uVar7;
      for (iVar4 = 0; iVar4 <= (pTVar2->m_dimensions).m_data[1] * 2; iVar4 = iVar4 + 1) {
        local_128._4_4_ = (float)iVar4;
        local_128._0_4_ = (float)iVar3;
        local_128._8_4_ = 0;
        local_128._12_4_ = uVar7;
        uVar8 = uVar7;
        for (lVar5 = 0; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
          SampleArguments::SampleArguments((SampleArguments *)local_118);
          uVar1 = *(undefined8 *)(this->m_testCase->m_dimensions).m_data;
          auVar9._0_4_ = (float)((int)uVar1 * 2);
          auVar9._4_4_ = (float)((int)((ulong)uVar1 >> 0x20) * 2);
          auVar9._8_8_ = 0;
          auVar9 = divps(local_128,auVar9);
          local_118._0_8_ = auVar9._0_8_;
          local_118._8_4_ = 0.0;
          local_118._12_4_ = 0.0;
          fStack_e4 = *(float *)((long)&DAT_009f0230 + lVar5);
          std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
          ::push_back(__return_storage_ptr__,(SampleArguments *)local_118);
          uVar8 = extraout_XMM0_Dd_00;
        }
        pTVar2 = this->m_testCase;
      }
      uVar7 = uVar8;
    }
  }
  else {
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 0.0;
    local_118._24_4_ = 0.0;
    local_118._28_4_ = 0.0;
    local_118._0_4_ = 0.0;
    local_118._4_4_ = 0.0;
    local_118._8_4_ = 0.0;
    local_118._12_4_ = 0.0;
    local_118._32_4_ = _DAT_009efc50;
    local_118._36_4_ = _UNK_009efc54;
    local_118._40_4_ = _UNK_009efc58;
    local_118._44_4_ = _UNK_009efc5c;
    stack0xffffffffffffff18 = &DAT_3f8000003f800000;
    local_e0 = 1.0;
    local_cc = 0;
    local_dc = 0.0;
    uStack_d8 = 0;
    uStack_d4 = 0;
    uStack_d0 = 0;
    local_c8[0] = _DAT_009efc50;
    local_c8[1] = _UNK_009efc54;
    local_c8[2] = _UNK_009efc58;
    local_c8[3] = _UNK_009efc5c;
    local_b8 = &DAT_3f8000003f800000;
    local_b0 = 0x3f800000;
    local_9c = 0;
    local_ac = 0;
    uStack_a8 = 0;
    uStack_a4 = 0;
    uStack_a0 = 0;
    local_98 = 0x40000000;
    uStack_94 = 0x40000000;
    uStack_90 = 0x40000000;
    uStack_8c = 0;
    local_88 = 0x40000000;
    uStack_84 = 0x40000000;
    uStack_80 = 0x40000000;
    uStack_7c = 0;
    uVar7 = 0;
    for (iVar3 = 0; iVar3 <= (pTVar2->m_dimensions).m_data[0] * 2; iVar3 = iVar3 + 1) {
      uVar8 = uVar7;
      for (iVar4 = 0; iVar4 <= (pTVar2->m_dimensions).m_data[1] * 2; iVar4 = iVar4 + 1) {
        local_128._4_4_ = (float)iVar4;
        local_128._0_4_ = (float)iVar3;
        local_128._8_4_ = 0;
        local_128._12_4_ = uVar7;
        uVar8 = uVar7;
        for (lVar5 = 0x10; lVar5 != 0xb0; lVar5 = lVar5 + 0x20) {
          SampleArguments::SampleArguments(&local_70);
          uVar1 = *(undefined8 *)(this->m_testCase->m_dimensions).m_data;
          auVar6._0_4_ = (float)((int)uVar1 * 2);
          auVar6._4_4_ = (float)((int)((ulong)uVar1 >> 0x20) * 2);
          auVar6._8_8_ = 0;
          auVar9 = divps(local_128,auVar6);
          local_70.coord.m_data[0] = (float)auVar9._0_8_;
          local_70.coord.m_data[1] = SUB84(auVar9._0_8_,4);
          local_70.coord.m_data[2] = 0.0;
          local_70.coord.m_data[3] = 0.0;
          local_70.dPdx.m_data._0_8_ = *(undefined8 *)(local_128 + lVar5);
          local_70.dPdx.m_data._8_8_ = *(undefined8 *)(local_128 + lVar5 + 8);
          local_70.dPdy.m_data._0_8_ = *(undefined8 *)(local_118 + lVar5);
          local_70.dPdy.m_data._8_8_ = *(undefined8 *)(local_118 + lVar5 + 8);
          std::vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
          ::push_back(__return_storage_ptr__,&local_70);
          uVar8 = extraout_XMM0_Dd;
        }
        pTVar2 = this->m_testCase;
      }
      uVar7 = uVar8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<SampleArguments> getSampleArgs (void) const
	{
		std::vector<SampleArguments> args;

		if (m_testCase->m_useDerivatives)
		{
			struct
			{
				Vec4 dPdx;
				Vec4 dPdy;
			}
			derivativePairs[] =
			{
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(2.0f, 2.0f, 2.0f, 0.0f), Vec4(2.0f, 2.0f, 2.0f, 0.0f)}
			};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
				    for (deUint32 derivNdx = 0; derivNdx < DE_LENGTH_OF_ARRAY(derivativePairs); ++derivNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.dPdx = derivativePairs[derivNdx].dPdx;
						cur.dPdy = derivativePairs[derivNdx].dPdy;

						args.push_back(cur);
					}
				}
			}
		}
		else
		{
			const float lodList[] = {-1.0, -0.5, 0.0, 0.5, 1.0, 1.5, 2.0};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
					for (deUint32 lodNdx = 0; lodNdx < DE_LENGTH_OF_ARRAY(lodList); ++lodNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.lod = lodList[lodNdx];

						args.push_back(cur);
					}
				}
			}
		}

		return args;
	}